

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O3

void __thiscall
vkt::wsi::anon_unknown_0::TriangleRenderer::recordFrame
          (TriangleRenderer *this,VkCommandBuffer cmdBuffer,deUint32 imageNdx,deUint32 frameNdx)

{
  undefined8 uVar1;
  VkResult VVar2;
  VkClearValue clearValue;
  VkCommandBufferBeginInfo cmdBufBeginParams;
  deUint32 local_8c;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  deUint64 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 *local_40;
  
  uVar1 = (((this->m_framebuffers).
            super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[imageNdx].m_ptr)->
          super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.object;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0x2a;
  uStack_70 = 0;
  local_8c = frameNdx;
  VVar2 = (*this->m_vkd->_vptr_DeviceInterface[0x49])(this->m_vkd,cmdBuffer,&local_78);
  ::vk::checkResult(VVar2,"m_vkd.beginCommandBuffer(cmdBuffer, &cmdBufBeginParams)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                    ,0x4c9);
  local_40 = &local_88;
  local_88 = 0x3e8000003e000000;
  local_80 = 0x3f8000003f400000;
  local_78 = CONCAT44(local_78._4_4_,0x2b);
  uStack_70 = 0;
  local_68 = (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal;
  local_58 = 0;
  local_50 = *(undefined8 *)(this->m_renderSize).m_data;
  local_48 = 1;
  uStack_60 = uVar1;
  (*this->m_vkd->_vptr_DeviceInterface[0x74])(this->m_vkd,cmdBuffer,&local_78,0);
  (*this->m_vkd->_vptr_DeviceInterface[0x4c])
            (this->m_vkd,cmdBuffer,0,
             (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
             m_internal);
  local_78 = 0;
  (*this->m_vkd->_vptr_DeviceInterface[0x58])
            (this->m_vkd,cmdBuffer,0,1,&this->m_vertexBuffer,&local_78);
  (*this->m_vkd->_vptr_DeviceInterface[0x73])
            (this->m_vkd,cmdBuffer,
             (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
             m_internal,1,0,4,&local_8c);
  (*this->m_vkd->_vptr_DeviceInterface[0x59])(this->m_vkd,cmdBuffer,3,1,0,0);
  (*this->m_vkd->_vptr_DeviceInterface[0x76])(this->m_vkd,cmdBuffer);
  VVar2 = (*this->m_vkd->_vptr_DeviceInterface[0x4a])(this->m_vkd,cmdBuffer);
  ::vk::checkResult(VVar2,"m_vkd.endCommandBuffer(cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                    ,0x4e9);
  return;
}

Assistant:

void TriangleRenderer::recordFrame (VkCommandBuffer	cmdBuffer,
									deUint32		imageNdx,
									deUint32		frameNdx) const
{
	const VkFramebuffer	curFramebuffer	= **m_framebuffers[imageNdx];

	{
		const VkCommandBufferBeginInfo	cmdBufBeginParams	=
		{
			VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
			DE_NULL,
			(VkCommandBufferUsageFlags)0,
			(const VkCommandBufferInheritanceInfo*)DE_NULL,
		};
		VK_CHECK(m_vkd.beginCommandBuffer(cmdBuffer, &cmdBufBeginParams));
	}

	{
		const VkClearValue			clearValue		= makeClearValueColorF32(0.125f, 0.25f, 0.75f, 1.0f);
		const VkRenderPassBeginInfo	passBeginParams	=
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,
			DE_NULL,
			*m_renderPass,
			curFramebuffer,
			{
				{ 0, 0 },
				{ (deUint32)m_renderSize.x(), (deUint32)m_renderSize.y() }
			},													// renderArea
			1u,													// clearValueCount
			&clearValue,										// pClearValues
		};
		m_vkd.cmdBeginRenderPass(cmdBuffer, &passBeginParams, VK_SUBPASS_CONTENTS_INLINE);
	}

	m_vkd.cmdBindPipeline(cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

	{
		const VkDeviceSize bindingOffset = 0;
		m_vkd.cmdBindVertexBuffers(cmdBuffer, 0u, 1u, &m_vertexBuffer.get(), &bindingOffset);
	}

	m_vkd.cmdPushConstants(cmdBuffer, *m_pipelineLayout, VK_SHADER_STAGE_VERTEX_BIT, 0u, (deUint32)sizeof(deUint32), &frameNdx);
	m_vkd.cmdDraw(cmdBuffer, 3u, 1u, 0u, 0u);
	m_vkd.cmdEndRenderPass(cmdBuffer);

	VK_CHECK(m_vkd.endCommandBuffer(cmdBuffer));
}